

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O2

int ReadAperiodicity(char *filename,double **aperiodicity)

{
  int iVar1;
  FILE *__stream;
  int i;
  long lVar2;
  int number_of_dimensions;
  int fft_size;
  int number_of_frames;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    iVar1 = anon_unknown.dwarf_bd0a::CheckHeader((FILE *)__stream,"AP  ");
    if (iVar1 != 0) {
      anon_unknown.dwarf_bd0a::LoadParameters
                ((FILE *)__stream,&number_of_frames,&fft_size,&number_of_dimensions);
      for (lVar2 = 0; lVar2 < number_of_frames; lVar2 = lVar2 + 1) {
        fread(aperiodicity[lVar2],8,(long)number_of_dimensions,__stream);
      }
      fclose(__stream);
      return 1;
    }
  }
  return 0;
}

Assistant:

int ReadAperiodicity(const char *filename, double **aperiodicity) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "AP  ") == 0) return 0;

  // Parameters
  int number_of_frames, fft_size, number_of_dimensions;
  LoadParameters(fp, &number_of_frames, &fft_size, &number_of_dimensions);

  // Data
  for (int i = 0; i < number_of_frames; ++i)
    fread(aperiodicity[i], 8, number_of_dimensions, fp);

  fclose(fp);
  return 1;
}